

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

bool __thiscall implementations::scheme::SchemeFrame::resolveArgument(SchemeFrame *this,cell *value)

{
  SchemeFrame *this_00;
  __shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if (value->type == List) {
    if ((value->list).
        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (value->list).
        super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (SchemeFrame *)operator_new(0x138);
      std::__shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr(&local_30,
                   &(this->
                    super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                    ).env.
                    super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>
                  );
      SchemeFrame(this_00,value,(env_p *)&local_30);
      this->subframe = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      this->subframe_mode = Argument;
      return false;
    }
  }
  else if (value->type == Symbol) {
    value = lookup(this,&value->val);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  push_back(&this->resolved_arguments,value);
  return true;
}

Assistant:

bool resolveArgument(const cell &value) {
		switch (value.type) {
		case Symbol:
			resolved_arguments.push_back(lookup(value.val));
			DEBUG(std::string("  resolveArgument(") + to_string(value) + std::string(") = ") + to_string(lookup(value.val)));
			return true;
		case List:
			if (value.list.empty()) {
				resolved_arguments.push_back(value);
				return true;
			}
			// Function call. Create frame to execute it.
			subframe = new SchemeFrame(value, env);
			subframe_mode = Argument;
			return false;
		default:
			DEBUG(std::string("  resolveArgument(") + to_string(value) + std::string(") = ") + to_string(value));
			resolved_arguments.push_back(value);
			return true;
		}
	}